

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=
          (Option<Catch::TestRunInfo> *this,Option<Catch::TestRunInfo> *_other)

{
  TestRunInfo *pTVar1;
  pointer pcVar2;
  
  pTVar1 = this->nullableValue;
  if ((pTVar1 != (TestRunInfo *)0x0) &&
     (pcVar2 = (pTVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pTVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  this->nullableValue = (TestRunInfo *)0x0;
  pTVar1 = _other->nullableValue;
  if (pTVar1 != (TestRunInfo *)0x0) {
    *(char **)this->storage = this->storage + 0x10;
    pcVar2 = (pTVar1->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this->storage,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
    this->nullableValue = (TestRunInfo *)this->storage;
  }
  return this;
}

Assistant:

Option& operator= ( Option const& _other ) {
            reset();
            if( _other )
                nullableValue = new( storage ) T( *_other );
            return *this;
        }